

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O2

void google::protobuf::
     STLDeleteElements<std::vector<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>>
               (vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
                *container)

{
  pointer ppMVar1;
  
  if (container !=
      (vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_> *)0x0) {
    STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::Message**,std::vector<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>>>
              ((__normal_iterator<google::protobuf::Message_**,_std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
                )(container->
                 super__Vector_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
                 )._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<google::protobuf::Message_**,_std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
                )(container->
                 super__Vector_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
    ppMVar1 = (container->
              super__Vector_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((container->
        super__Vector_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
        )._M_impl.super__Vector_impl_data._M_finish != ppMVar1) {
      (container->
      super__Vector_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>)
      ._M_impl.super__Vector_impl_data._M_finish = ppMVar1;
    }
  }
  return;
}

Assistant:

void STLDeleteElements(T *container) {
  if (!container) return;
  STLDeleteContainerPointers(container->begin(), container->end());
  container->clear();
}